

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O0

void __thiscall gvr::CameraCollection::loadCamera(CameraCollection *this,char *file)

{
  bool bVar1;
  double *pdVar2;
  char *in_RSI;
  PinholeCamera cam;
  Properties prop_1;
  PinholeCamera cam1;
  PinholeCamera cam0;
  double dmax;
  double dmin;
  double doffs;
  double t;
  string s;
  Matrix33d A;
  Properties prop;
  Properties mprop;
  size_t i;
  string name;
  string *in_stack_fffffffffffffa08;
  allocator *s_00;
  PinholeCamera *in_stack_fffffffffffffa10;
  allocator *this_00;
  value_type *in_stack_fffffffffffffa18;
  allocator *__x;
  Properties *in_stack_fffffffffffffa20;
  PinholeCamera local_598 [280];
  Properties local_480;
  allocator local_449;
  string local_448 [8];
  SMatrix<double,_3,_3> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  Properties *in_stack_fffffffffffffbd0;
  PinholeCamera local_428 [144];
  char *in_stack_fffffffffffffc68;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  Properties *in_stack_fffffffffffffc80;
  SVector<double,_3> local_310;
  allocator local_2f1;
  string local_2f0 [32];
  PinholeCamera local_2d0 [287];
  allocator local_1b1;
  string local_1b0 [32];
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  allocator local_161;
  string local_160 [32];
  double local_140;
  string local_138 [32];
  SMatrix<double,_3,_3> local_118;
  Properties local_d0;
  char local_a0 [48];
  string local_70 [32];
  long local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = std::__cxx11::string::find_last_of((char *)local_30,0x15ca40);
  if (local_50 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,local_70);
    std::__cxx11::string::~string(local_70);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
  if (bVar1) {
    gutil::Properties::Properties(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18);
    gutil::Properties::Properties((Properties *)0x158d52);
    gmath::SMatrix<double,_3,_3>::SMatrix(&local_118);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::__cxx11::string::string(local_138);
    gutil::Properties::getString(local_a0,(string *)0x15cb89,(char *)local_138);
    gutil::Properties::putString((char *)&local_d0,(string *)"camera.width");
    gutil::Properties::getString(local_a0,(string *)0x15cb96,(char *)local_138);
    gutil::Properties::putString((char *)&local_d0,(string *)"camera.height");
    gmath::SMatrix<double,_3,_3>::operator()(&local_118,0,0);
    gutil::Properties::putValue<double>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (double *)in_stack_fffffffffffffbc0);
    gutil::Properties::getValue<double>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (double *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    gutil::Properties::putValue<double>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (double *)in_stack_fffffffffffffbc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"[1 0 0; 0 1 0; 0 0 1]",&local_161);
    gutil::Properties::putString((char *)&local_d0,(string *)"camera.R");
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    gutil::Properties::putValue<char[8]>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (char (*) [8])in_stack_fffffffffffffbc0);
    gutil::Properties::getValue<double>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (double *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    gutil::Properties::getValue<double>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (double *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    gutil::Properties::getValue<double>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (double *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    if ((0.0 < local_178) && (0.0 < local_180)) {
      pdVar2 = gmath::SMatrix<double,_3,_3>::operator()(&local_118,0,0);
      local_188 = (*pdVar2 * local_140) / (local_180 + local_170);
      gutil::Properties::putValue<double>
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (double *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffa20 =
           (Properties *)gmath::SMatrix<double,_3,_3>::operator()(&local_118,0,0);
      local_190 = (*(double *)&(in_stack_fffffffffffffa20->data)._M_t._M_impl * local_140) /
                  (local_178 + local_170);
      gutil::Properties::putValue<double>
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (double *)in_stack_fffffffffffffbc0);
    }
    __x = &local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"cam0, cam1",__x);
    gutil::Properties::putString((char *)&local_d0,(string *)"camera.match");
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    gmath::PinholeCamera::PinholeCamera(local_2d0,&local_d0,-1);
    this_00 = &local_2f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"cam0",this_00);
    gmath::Camera::setName((Camera *)this_00,in_stack_fffffffffffffa08);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              ((vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_> *)
               in_stack_fffffffffffffa20,(value_type *)__x);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    gmath::SVector<double,_3>::SVector(&local_310,local_140,0.0,0.0);
    gutil::Properties::putValue<gmath::SVector<double,3>>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (SVector<double,_3> *)in_stack_fffffffffffffbc0);
    gmath::PinholeCamera::PinholeCamera(local_428,&local_d0,-1);
    s_00 = &local_449;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"cam1",s_00);
    gmath::Camera::setName((Camera *)this_00,(string *)s_00);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              ((vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_> *)
               in_stack_fffffffffffffa20,(value_type *)__x);
    gmath::PinholeCamera::~PinholeCamera((PinholeCamera *)this_00);
    gmath::PinholeCamera::~PinholeCamera((PinholeCamera *)this_00);
    std::__cxx11::string::~string(local_138);
    gutil::Properties::~Properties((Properties *)0x15937c);
    gutil::Properties::~Properties((Properties *)0x159389);
  }
  else {
    gutil::Properties::Properties(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18);
    gmath::PinholeCamera::PinholeCamera(local_598,&local_480,-1);
    gmath::Camera::setName((Camera *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              ((vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_> *)
               in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    gmath::PinholeCamera::~PinholeCamera(in_stack_fffffffffffffa10);
    gutil::Properties::~Properties((Properties *)0x159546);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CameraCollection::loadCamera(const char *file)
{
  std::string name=file;

  size_t i=name.find_last_of("/\\");

  if (i != name.npos)
  {
    name=name.substr(i+1);
  }

  if (name == "calib.txt")
  {
    // conversion of pinhole camera parameters from Middlebury format

    gutil::Properties mprop(file), prop;

    gmath::Matrix33d A;
    mprop.getValue("cam0", A);
    prop.putValue("camera.A", A);

    std::string s;
    mprop.getString("width", s, "0");
    prop.putString("camera.width", s);
    mprop.getString("height", s, "0");
    prop.putString("camera.height", s);

    prop.putValue("f", A(0, 0));

    double t;
    mprop.getValue("baseline", t);
    prop.putValue("t", t);

    prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");
    prop.putValue("camera.T", "[0 0 0]");

    double doffs, dmin, dmax;

    mprop.getValue("doffs", doffs, "0");
    mprop.getValue("vmin", dmin, "0");
    mprop.getValue("vmax", dmax, "0");

    if (dmin > 0 && dmax > 0)
    {
      prop.putValue("camera.zmin", A(0, 0)*t/(dmax+doffs));
      prop.putValue("camera.zmax", A(0, 0)*t/(dmin+doffs));
    }

    prop.putString("camera.match", "cam0, cam1");

    gmath::PinholeCamera cam0(prop);
    cam0.setName("cam0");
    cl.push_back(cam0);

    mprop.getValue("cam1", A);
    prop.putValue("camera.A", A);
    prop.putValue("camera.T", gmath::Vector3d(t, 0, 0));

    gmath::PinholeCamera cam1(prop);
    cam1.setName("cam1");
    cl.push_back(cam1);
  }
  else
  {
    // load text file as pinhole camera and store in list

    gutil::Properties prop(file);
    gmath::PinholeCamera cam(prop);
    cam.setName(name);

    // add camera model

    cl.push_back(cam);
  }
}